

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::ReadBuffersResponse::ParseFromArray
          (ReadBuffersResponse *this,void *raw,size_t size)

{
  byte bVar1;
  pointer pRVar2;
  pointer pRVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  long lVar7;
  vector<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
  *this_00;
  bool bVar8;
  uint uVar9;
  ulong *puVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong *in_R11;
  uint *puVar17;
  ulong *puVar18;
  pointer pRVar19;
  bool bVar20;
  ulong local_60;
  Field local_58;
  vector<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
  *local_48;
  ulong *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pRVar2 = (this->slices_).
           super__Vector_base<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (this->slices_).
           super__Vector_base<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pRVar19 = pRVar2;
  if (pRVar3 != pRVar2) {
    do {
      (**(pRVar19->super_CppMessageObj)._vptr_CppMessageObj)(pRVar19);
      pRVar19 = pRVar19 + 1;
    } while (pRVar19 != pRVar3);
    (this->slices_).
    super__Vector_base<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar2;
  }
  this_00 = &this->slices_;
  local_38 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar18 = (ulong *)(size + (long)raw);
  do {
    lVar7 = 7;
    if (puVar18 <= raw) goto LAB_0026a4df;
    uVar12 = (ulong)(char)(byte)*raw;
    puVar11 = (ulong *)((long)raw + 1);
    if ((long)uVar12 < 0) {
      bVar1 = (byte)*raw;
      uVar4 = (ulong)(bVar1 & 0x7f);
      bVar8 = false;
      puVar13 = puVar11;
      for (; (uVar12 = uVar4, puVar10 = puVar13, (char)bVar1 < '\0' &&
             (bVar20 = 0x38 < lVar7 - 7U, bVar8 = bVar20 || puVar18 <= puVar13, uVar12 = 0,
             puVar10 = puVar11, !bVar20 && puVar18 > puVar13)); lVar7 = lVar7 + 7) {
        bVar1 = (byte)*puVar13;
        in_R11 = (ulong *)((ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f));
        puVar13 = (ulong *)((long)puVar13 + 1);
        uVar4 = uVar4 | (ulong)in_R11;
      }
      puVar11 = puVar10;
      if (bVar8) {
        puVar11 = (ulong *)raw;
        uVar12 = 0;
      }
      if (puVar11 == (ulong *)raw) goto LAB_0026a4df;
    }
    uVar9 = (uint)(uVar12 >> 3);
    if ((uVar9 == 0) || (puVar18 <= puVar11)) {
switchD_0026a352_caseD_3:
      bVar8 = false;
      uVar12 = 0;
      local_58.int_value_ = 0;
    }
    else {
      switch((uint)uVar12 & 7) {
      case 0:
        uVar14 = 0;
        bVar8 = puVar11 >= puVar18;
        if (puVar11 < puVar18) {
          in_R11 = (ulong *)((long)puVar11 + 1);
          uVar4 = (ulong)((byte)*puVar11 & 0x7f);
          uVar5 = uVar4;
          uVar16 = 0;
          if ((char)(byte)*puVar11 < '\0') {
            uVar5 = 0;
            uVar16 = 0;
            lVar7 = 7;
            puVar13 = in_R11;
            do {
              bVar20 = 0x38 < lVar7 - 7U;
              bVar8 = bVar20 || puVar18 <= puVar13;
              if (bVar20 || puVar18 <= puVar13) goto LAB_0026a4e6;
              uVar15 = *puVar13;
              puVar13 = (ulong *)((long)puVar13 + 1);
              uVar4 = uVar4 | (ulong)((byte)uVar15 & 0x7f) << ((byte)lVar7 & 0x3f);
              lVar7 = lVar7 + 7;
            } while ((char)(byte)uVar15 < '\0');
            uVar5 = uVar4 & 0xffffffff;
            in_R11 = puVar13;
            uVar16 = (uint)(uVar4 >> 0x20);
          }
        }
        else {
          uVar5 = 0;
          uVar16 = 0;
        }
LAB_0026a4e6:
        uVar4 = (ulong)uVar16;
        if (bVar8) {
          in_R11 = puVar11;
          uVar4 = uVar14;
          uVar5 = uVar14;
        }
        local_40 = (ulong *)raw;
        if (in_R11 != puVar11) goto LAB_0026a511;
        uVar12 = 0;
        bVar8 = false;
        local_58.int_value_ = uVar14;
        goto LAB_0026a54b;
      case 1:
        in_R11 = puVar11 + 1;
        if (puVar18 < in_R11) {
LAB_0026a4df:
          uVar12 = 0;
          bVar8 = false;
          local_58.int_value_ = 0;
          goto LAB_0026a54b;
        }
        uVar5 = *puVar11;
        uVar4 = uVar5 >> 0x20;
        break;
      case 2:
        bVar8 = puVar11 >= puVar18;
        uVar5 = local_60;
        if (puVar11 < puVar18) {
          puVar13 = (ulong *)((long)puVar11 + 1);
          uVar4 = (ulong)((byte)*puVar11 & 0x7f);
          in_R11 = puVar13;
          uVar5 = uVar4;
          if ((char)(byte)*puVar11 < '\0') {
            lVar7 = 7;
            puVar10 = puVar13;
            do {
              bVar8 = 0x38 < lVar7 - 7U || puVar18 <= puVar10;
              in_R11 = puVar13;
              uVar5 = local_60;
              if (bVar8) break;
              uVar14 = *puVar10;
              puVar10 = (ulong *)((long)puVar10 + 1);
              uVar4 = uVar4 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar7 & 0x3f);
              lVar7 = lVar7 + 7;
              in_R11 = puVar10;
              uVar5 = uVar4;
            } while ((char)(byte)uVar14 < '\0');
          }
        }
        uVar4 = 0;
        local_60 = uVar5;
        if (bVar8) {
          in_R11 = puVar11;
          local_60 = uVar4;
        }
        if (in_R11 == puVar11) {
          uVar5 = 0;
          bVar8 = false;
          uVar14 = 0;
        }
        else if ((ulong)((long)puVar18 - (long)in_R11) < local_60) {
          uVar4 = 0;
          uVar5 = 0;
          bVar8 = false;
          uVar14 = 0;
        }
        else {
          uVar4 = (ulong)in_R11 >> 0x20;
          uVar5 = (ulong)in_R11 & 0xffffffff;
          in_R11 = (ulong *)((long)in_R11 + local_60);
          bVar8 = true;
          uVar14 = local_60;
        }
        if (!bVar8) goto LAB_0026a4df;
        goto LAB_0026a511;
      default:
        goto switchD_0026a352_caseD_3;
      case 5:
        in_R11 = (ulong *)((long)puVar11 + 4);
        uVar4 = 0;
        if (puVar18 < in_R11) goto LAB_0026a4df;
        uVar5 = (ulong)(uint)*puVar11;
      }
      uVar14 = 0;
LAB_0026a511:
      bVar8 = true;
      raw = in_R11;
      if ((uVar9 < 0x10000) && (uVar14 < 0x10000000)) {
        local_58.int_value_ = uVar5 & 0xffffffff | uVar4 << 0x20;
        uVar12 = uVar14 | (uVar12 >> 3) << 0x20 | (ulong)((uint)uVar12 & 7) << 0x30;
        bVar8 = false;
      }
      else {
        local_58.int_value_ = 0;
        uVar12 = 0;
      }
    }
LAB_0026a54b:
    puVar17 = &switchD_0026a352::switchdataD_0034f380;
    if (!bVar8) {
      local_58.size_ = (uint32_t)uVar12;
      local_58.type_ = (uint8_t)(uVar12 >> 0x30);
      local_58.id_ = (uint16_t)(uVar12 >> 0x20);
      local_48 = this_00;
      uVar4 = local_58.int_value_;
      do {
        if (local_58.id_ == 0) {
          return puVar18 == (ulong *)raw;
        }
        uVar6 = (ushort)(uVar12 >> 0x20);
        if (uVar6 < 3) {
          (this->_has_field_).super__Base_bitset<1UL>._M_w =
               (this->_has_field_).super__Base_bitset<1UL>._M_w |
               1L << ((byte)(uVar12 >> 0x20) & 0x3f);
        }
        if (uVar6 == 2) {
          std::
          vector<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
          ::emplace_back<>(this_00);
          pRVar2 = (this->slices_).
                   super__Vector_base<perfetto::protos::gen::ReadBuffersResponse_Slice,_std::allocator<perfetto::protos::gen::ReadBuffersResponse_Slice>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          (*pRVar2[-1].super_CppMessageObj._vptr_CppMessageObj[4])
                    (pRVar2 + -1,local_58.int_value_,(ulong)local_58.size_);
        }
        else {
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_58,local_38);
        }
        do {
          if (puVar18 <= raw) goto LAB_0026a705;
          uVar12 = (ulong)(char)(byte)*raw;
          puVar11 = (ulong *)((long)raw + 1);
          if ((long)uVar12 < 0) {
            uVar5 = (ulong)((byte)*raw & 0x7f);
            bVar8 = false;
            uVar12 = uVar5;
            puVar13 = puVar11;
            if ((char)(byte)*raw < '\0') {
              lVar7 = 7;
              puVar10 = puVar11;
              do {
                bVar8 = 0x38 < lVar7 - 7U || puVar18 <= puVar10;
                uVar12 = 0;
                puVar13 = puVar11;
                if (bVar8) break;
                uVar14 = *puVar10;
                puVar13 = (ulong *)((long)puVar10 + 1);
                uVar5 = uVar5 | (ulong)((byte)uVar14 & 0x7f) << ((byte)lVar7 & 0x3f);
                lVar7 = lVar7 + 7;
                uVar12 = uVar5;
                puVar10 = puVar13;
              } while ((char)(byte)uVar14 < '\0');
            }
            puVar11 = puVar13;
            if (bVar8) {
              puVar11 = (ulong *)raw;
              uVar12 = 0;
            }
            if (puVar11 == (ulong *)raw) goto LAB_0026a705;
          }
          uVar9 = (uint)(uVar12 >> 3);
          if ((uVar9 == 0) || (puVar18 <= puVar11)) {
switchD_0026a78d_caseD_3:
            local_58.int_value_ = 0;
            bVar8 = false;
            uVar12 = 0;
            goto LAB_0026a98d;
          }
          switch((uint)uVar12 & 7) {
          case 0:
            local_58.int_value_ = 0;
            bVar8 = puVar11 >= puVar18;
            if (puVar11 < puVar18) {
              puVar13 = (ulong *)((long)puVar11 + 1);
              uVar16 = (byte)*puVar11 & 0x7f;
              uVar5 = (ulong)uVar16;
              uVar14 = (ulong)uVar16;
              puVar17 = (uint *)puVar13;
              uVar16 = 0;
              if ((char)(byte)*puVar11 < '\0') {
                uVar14 = 0;
                lVar7 = 7;
                puVar10 = puVar13;
                do {
                  bVar20 = 0x38 < lVar7 - 7U;
                  bVar8 = bVar20 || puVar18 <= puVar10;
                  puVar17 = (uint *)puVar13;
                  uVar16 = 0;
                  if (bVar20 || puVar18 <= puVar10) break;
                  bVar1 = (byte)*puVar10;
                  puVar10 = (ulong *)((long)puVar10 + 1);
                  uVar5 = uVar5 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
                  lVar7 = lVar7 + 7;
                  if (-1 < (char)bVar1) {
                    uVar14 = uVar5 & 0xffffffff;
                  }
                  puVar17 = (uint *)puVar10;
                  uVar16 = (uint)(uVar5 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              uVar14 = 0;
              uVar16 = 0;
            }
            if (bVar8) {
              uVar14 = local_58.int_value_;
            }
            uVar5 = (ulong)uVar16;
            if (bVar8) {
              puVar17 = (uint *)puVar11;
              uVar5 = local_58.int_value_;
            }
            this_00 = local_48;
            uVar15 = local_58.int_value_;
            local_40 = (ulong *)raw;
            if ((ulong *)puVar17 == puVar11) {
              uVar12 = 0;
              bVar8 = false;
            }
            else {
LAB_0026a942:
              raw = puVar17;
              bVar8 = true;
              puVar17 = (uint *)raw;
              if ((uVar9 < 0x10000) && (uVar15 < 0x10000000)) {
                local_58.int_value_ = uVar14 & 0xffffffff | uVar5 << 0x20;
                uVar12 = uVar15 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
                bVar8 = false;
              }
              else {
                local_58.int_value_ = 0;
                uVar12 = 0;
              }
            }
            break;
          case 1:
            puVar17 = (uint *)(puVar11 + 1);
            if (puVar17 <= puVar18) {
              uVar14 = *puVar11;
              uVar5 = uVar14 >> 0x20;
LAB_0026a7f1:
              uVar15 = 0;
              goto LAB_0026a942;
            }
            goto LAB_0026a705;
          case 2:
            bVar8 = puVar11 >= puVar18;
            uVar5 = uVar4;
            if (puVar11 < puVar18) {
              puVar13 = (ulong *)((long)puVar11 + 1);
              uVar14 = (ulong)((byte)*puVar11 & 0x7f);
              puVar17 = (uint *)puVar13;
              uVar5 = uVar14;
              if ((char)(byte)*puVar11 < '\0') {
                lVar7 = 7;
                puVar10 = puVar13;
                do {
                  bVar8 = 0x38 < lVar7 - 7U || puVar18 <= puVar10;
                  puVar17 = (uint *)puVar13;
                  uVar5 = uVar4;
                  if (bVar8) break;
                  uVar15 = *puVar10;
                  puVar10 = (ulong *)((long)puVar10 + 1);
                  uVar14 = uVar14 | (ulong)((byte)uVar15 & 0x7f) << ((byte)lVar7 & 0x3f);
                  lVar7 = lVar7 + 7;
                  puVar17 = (uint *)puVar10;
                  uVar5 = uVar14;
                } while ((char)(byte)uVar15 < '\0');
              }
            }
            uVar4 = uVar5;
            if (bVar8) {
              puVar17 = (uint *)puVar11;
              uVar4 = 0;
            }
            if (((ulong *)puVar17 == puVar11) || ((ulong)((long)puVar18 - (long)puVar17) < uVar4)) {
              uVar14 = 0;
              uVar5 = 0;
              bVar8 = false;
              uVar15 = 0;
            }
            else {
              uVar5 = (ulong)puVar17 >> 0x20;
              uVar14 = (ulong)puVar17 & 0xffffffff;
              puVar17 = (uint *)((long)puVar17 + uVar4);
              bVar8 = true;
              uVar15 = uVar4;
            }
            if (bVar8) goto LAB_0026a942;
            local_58.int_value_ = 0;
            uVar12 = 0;
            bVar8 = false;
            break;
          default:
            goto switchD_0026a78d_caseD_3;
          case 5:
            puVar17 = (uint *)((long)puVar11 + 4);
            uVar5 = 0;
            if (puVar17 <= puVar18) {
              uVar14 = (ulong)(uint)*puVar11;
              goto LAB_0026a7f1;
            }
LAB_0026a705:
            local_58.int_value_ = 0;
            uVar12 = 0;
            bVar8 = false;
          }
LAB_0026a98d:
        } while (bVar8);
        local_58.size_ = (uint32_t)uVar12;
        local_58.type_ = (uint8_t)(uVar12 >> 0x30);
        local_58.id_ = (uint16_t)(uVar12 >> 0x20);
      } while( true );
    }
  } while( true );
}

Assistant:

bool ReadBuffersResponse::ParseFromArray(const void* raw, size_t size) {
  slices_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 2 /* slices */:
        slices_.emplace_back();
        slices_.back().ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}